

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall
PrintfTest_VSPrintfMakeArgsExample_Test::TestBody(PrintfTest_VSPrintfMakeArgsExample_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args2;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_char[10]>
  as2;
  char (*in_stack_00000108) [17];
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  in_stack_00000110;
  AssertionResult gtest_ar;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_const_char_*>
  as;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_char[10]>
  *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char (*in_stack_fffffffffffffe98) [24];
  char (*expected) [24];
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_const_char_*>
  *in_stack_fffffffffffffea0;
  string *actual_expression;
  char *in_stack_fffffffffffffea8;
  int line;
  undefined7 in_stack_fffffffffffffeb0;
  Type type;
  AssertHelper *this_00;
  string local_110 [24];
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  char local_c8 [64];
  undefined8 local_88;
  undefined8 uStack_80;
  AssertHelper local_78 [4];
  AssertionResult local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  char *local_38;
  undefined4 local_2c;
  undefined1 local_28 [40];
  
  local_2c = 0x2a;
  local_38 = "something";
  type = (Type)((ulong)local_28 >> 0x20);
  fmt::v5::
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_const_char_*>
  ::format_arg_store(in_stack_fffffffffffffea0,(int *)in_stack_fffffffffffffe98,
                     (char **)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  fmt::v5::
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
  ::basic_format_args<int,char_const*>
            ((basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             (format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_const_char_*>
              *)in_stack_fffffffffffffe88);
  local_88 = local_48;
  uStack_80 = uStack_40;
  this_00 = local_78;
  fmt::v5::vsprintf<char[17],char>(in_stack_00000108,in_stack_00000110);
  testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
            (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string((string *)local_78);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffea8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x139279);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffeb0),
               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(char *)in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::Message::~Message((Message *)0x1392d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13932e);
  expected = (char (*) [24])local_c8;
  fmt::v5::make_printf_args<int,char[10]>
            ((int *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             (char (*) [10])in_stack_fffffffffffffe88);
  fmt::v5::
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
  ::basic_format_args<int,char[10]>
            ((basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88);
  actual_expression = local_110;
  fmt::v5::vsprintf<char[17],char>(in_stack_00000108,in_stack_00000110);
  testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
            (in_stack_fffffffffffffea8,(char *)actual_expression,expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  line = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  std::__cxx11::string::~string(local_110);
  uVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff10);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x139455);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffeb0),line,
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    testing::Message::~Message((Message *)0x1394a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1394f0);
  return;
}

Assistant:

TEST(PrintfTest, VSPrintfMakeArgsExample) {
  fmt::format_arg_store<fmt::printf_context, int, const char *> as{
      42, "something"};
  fmt::basic_format_args<fmt::printf_context> args(as);
  EXPECT_EQ(
      "[42] something happened", fmt::vsprintf("[%d] %s happened", args));
  auto as2 = fmt::make_printf_args(42, "something");
  fmt::basic_format_args<fmt::printf_context> args2(as2);
  EXPECT_EQ(
      "[42] something happened", fmt::vsprintf("[%d] %s happened", args2));
  //the older gcc versions can't cast the return value
#if !defined(__GNUC__) || (__GNUC__ > 4) 
  EXPECT_EQ(
      "[42] something happened",
      fmt::vsprintf(
          "[%d] %s happened", fmt::make_printf_args(42, "something")));
#endif
}